

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

IdList * sqlite3IdListAppend(Parse *pParse,IdList *pList,Token *pToken)

{
  sqlite3 *db;
  uint uVar1;
  undefined4 uVar2;
  IdList_item *pIVar3;
  char *pcVar4;
  RenameToken *pRVar5;
  int i;
  int local_2c;
  
  db = pParse->db;
  if ((pList != (IdList *)0x0) ||
     (pList = (IdList *)sqlite3DbMallocZero(db,0x10), pList != (IdList *)0x0)) {
    pIVar3 = (IdList_item *)sqlite3ArrayAllocate(db,pList->a,0x10,&pList->nId,&local_2c);
    pList->a = pIVar3;
    if (-1 < (long)local_2c) {
      pcVar4 = sqlite3NameFromToken(db,pToken);
      pList->a[local_2c].zName = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return pList;
      }
      if (pParse->eParseMode < 2) {
        return pList;
      }
      pRVar5 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20);
      if (pRVar5 == (RenameToken *)0x0) {
        return pList;
      }
      pRVar5->p = pcVar4;
      uVar1 = pToken->n;
      uVar2 = *(undefined4 *)&pToken->field_0xc;
      (pRVar5->t).z = pToken->z;
      (pRVar5->t).n = uVar1;
      *(undefined4 *)&(pRVar5->t).field_0xc = uVar2;
      pRVar5->pNext = pParse->pRename;
      pParse->pRename = pRVar5;
      return pList;
    }
    sqlite3IdListDelete(db,pList);
  }
  return (IdList *)0x0;
}

Assistant:

SQLITE_PRIVATE IdList *sqlite3IdListAppend(Parse *pParse, IdList *pList, Token *pToken){
  sqlite3 *db = pParse->db;
  int i;
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(IdList) );
    if( pList==0 ) return 0;
  }
  pList->a = sqlite3ArrayAllocate(
      db,
      pList->a,
      sizeof(pList->a[0]),
      &pList->nId,
      &i
  );
  if( i<0 ){
    sqlite3IdListDelete(db, pList);
    return 0;
  }
  pList->a[i].zName = sqlite3NameFromToken(db, pToken);
  if( IN_RENAME_OBJECT && pList->a[i].zName ){
    sqlite3RenameTokenMap(pParse, (void*)pList->a[i].zName, pToken);
  }
  return pList;
}